

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio_json_parser.h
# Opt level: O0

void fio_json_unescape_str_internal(uint8_t **dest,uint8_t **src)

{
  int iVar1;
  uint32_t local_1c;
  uint32_t t;
  uint8_t **src_local;
  uint8_t **dest_local;
  
  *src = *src + 1;
  switch(**src) {
  case '\"':
  case '/':
  case '\\':
  default:
    goto LAB_0018debe;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
    if ((0x2f < (*src)[1]) && ((*src)[1] < 0x38)) {
      **dest = (**src + 0xd0) * '\b' | (*src)[1] - 0x30;
      *dest = *dest + 1;
      *src = *src + 2;
      return;
    }
    goto LAB_0018debe;
  case 'b':
    **dest = '\b';
    *src = *src + 1;
    *dest = *dest + 1;
    break;
  case 'f':
    **dest = '\f';
    *src = *src + 1;
    *dest = *dest + 1;
    break;
  case 'n':
    **dest = '\n';
    *src = *src + 1;
    *dest = *dest + 1;
    break;
  case 'r':
    **dest = '\r';
    *src = *src + 1;
    *dest = *dest + 1;
    break;
  case 't':
    **dest = '\t';
    *src = *src + 1;
    *dest = *dest + 1;
    break;
  case 'u':
    if ((((""[(*src)[1]] != '\0') && (""[(*src)[2]] != '\0')) && (""[(*src)[3]] != '\0')) &&
       (""[(*src)[4]] != '\0')) {
      local_1c = ((""[(*src)[1]] - 1) * 0x10 | ""[(*src)[2]] - 1) << 8 |
                 (""[(*src)[3]] - 1) * 0x10 | ""[(*src)[4]] - 1;
      if (((((*src)[5] == '\\') && ((*src)[6] == 'u')) &&
          ((""[(*src)[7]] != '\0' && ((""[(*src)[8]] != '\0' && (""[(*src)[9]] != '\0')))))) &&
         (""[(*src)[10]] != '\0')) {
        local_1c = (((""[(*src)[8]] - 1) * 0x100 | (""[(*src)[9]] - 1) * 0x10 | ""[(*src)[10]] - 1)
                    & 0x3ff | (local_1c & 0x3ff) << 10) + 0x10000;
        *src = *src + 6;
      }
      iVar1 = utf8_from_u32(*dest,local_1c);
      *dest = *dest + iVar1;
      *src = *src + 5;
      return;
    }
    goto LAB_0018debe;
  case 'x':
    if ((""[(*src)[1]] != '\0') && (""[(*src)[2]] != '\0')) {
      **dest = (""[(*src)[1]] + 0xff) * '\x10' | ""[(*src)[2]] - 1;
      *dest = *dest + 1;
      *src = *src + 3;
      return;
    }
LAB_0018debe:
    **dest = **src;
    *src = *src + 1;
    *dest = *dest + 1;
  }
  return;
}

Assistant:

static void __attribute__((unused))
fio_json_unescape_str_internal(uint8_t **dest, const uint8_t **src) {
  ++(*src);
  switch (**src) {
  case 'b':
    **dest = '\b';
    ++(*src);
    ++(*dest);
    return; /* from switch */
  case 'f':
    **dest = '\f';
    ++(*src);
    ++(*dest);
    return; /* from switch */
  case 'n':
    **dest = '\n';
    ++(*src);
    ++(*dest);
    return; /* from switch */
  case 'r':
    **dest = '\r';
    ++(*src);
    ++(*dest);
    return; /* from switch */
  case 't':
    **dest = '\t';
    ++(*src);
    ++(*dest);
    return;   /* from switch */
  case 'u': { /* test for octal notation */
    if (is_hex[(*src)[1]] && is_hex[(*src)[2]] && is_hex[(*src)[3]] &&
        is_hex[(*src)[4]]) {
      uint32_t t =
          ((((is_hex[(*src)[1]] - 1) << 4) | (is_hex[(*src)[2]] - 1)) << 8) |
          (((is_hex[(*src)[3]] - 1) << 4) | (is_hex[(*src)[4]] - 1));
      if ((*src)[5] == '\\' && (*src)[6] == 'u' && is_hex[(*src)[7]] &&
          is_hex[(*src)[8]] && is_hex[(*src)[9]] && is_hex[(*src)[10]]) {
        /* Serrogate Pair */
        t = (t & 0x03FF) << 10;
        t |= ((((((is_hex[(*src)[7]] - 1) << 4) | (is_hex[(*src)[8]] - 1))
                << 8) |
               (((is_hex[(*src)[9]] - 1) << 4) | (is_hex[(*src)[10]] - 1))) &
              0x03FF);
        t += 0x10000;
        (*src) += 6;
      }
      *dest += utf8_from_u32(*dest, t);
      *src += 5;
      return;
    } else
      goto invalid_escape;
  }
  case 'x': { /* test for hex notation */
    if (is_hex[(*src)[1]] && is_hex[(*src)[2]]) {
      **dest = ((is_hex[(*src)[1]] - 1) << 4) | (is_hex[(*src)[2]] - 1);
      ++(*dest);
      (*src) += 3;
      return;
    } else
      goto invalid_escape;
  }
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7': { /* test for octal notation */
    if ((*src)[1] >= '0' && (*src)[1] <= '7') {
      **dest = (((*src)[0] - '0') << 3) | ((*src)[1] - '0');
      ++(*dest);
      (*src) += 2;
      break; /* from switch */
    } else
      goto invalid_escape;
  }
  case '"':
  case '\\':
  case '/':
  /* fallthrough */
  default:
  invalid_escape:
    **dest = **src;
    ++(*src);
    ++(*dest);
  }
}